

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

void __thiscall
MSX::AYPortHandler::Joystick::did_set_input(Joystick *this,Input *input,bool is_active)

{
  byte bVar1;
  byte bVar2;
  
  switch(input->type) {
  case Up:
    bVar1 = 1;
    break;
  case Down:
    bVar1 = 2;
    break;
  case Left:
    bVar1 = 4;
    break;
  case Right:
    bVar1 = 8;
    break;
  default:
    goto switchD_00309d36_caseD_4;
  case Fire:
    if (1 < (ulong)input->info) {
      return;
    }
    bVar1 = (input->info != (Info)0x0) * '\x10' + 0x10;
  }
  bVar2 = this->state_ | bVar1;
  if (is_active) {
    bVar2 = ~bVar1 & this->state_;
  }
  this->state_ = bVar2;
switchD_00309d36_caseD_4:
  return;
}

Assistant:

void did_set_input(const Input &input, bool is_active) final {
					uint8_t mask = 0;
					switch(input.type) {
						default: return;
						case Input::Up:		mask = 0x01;	break;
						case Input::Down:	mask = 0x02;	break;
						case Input::Left:	mask = 0x04;	break;
						case Input::Right:	mask = 0x08;	break;
						case Input::Fire:
							if(input.info.control.index >= 2) return;
							mask = input.info.control.index ? 0x20 : 0x10;
						break;
					}

					if(is_active) state_ &= ~mask; else state_ |= mask;
				}